

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

tadsobj_objid_and_ptr * __thiscall vm_tadsobj_hdr::get_inh_search_path(vm_tadsobj_hdr *this)

{
  ushort uVar1;
  CVmMetaclass *pCVar2;
  tadsobj_objid_and_ptr *ptVar3;
  vm_tadsobj_hdr *in_RDI;
  CVmObjTads *scobj;
  vm_obj_id_t sc;
  vm_tadsobj_sc *scp;
  uint i;
  pfq_ele *q_ins;
  uint cnt;
  vm_tadsobj_hdr *curhdr;
  pfq_ele *q_ele;
  CVmObjTadsInhQueue *q;
  pfq_ele *local_68;
  pfq_ele *ins_pt;
  undefined4 in_stack_ffffffffffffffb0;
  vm_obj_id_t vVar4;
  vm_tadsobj_sc *pvVar5;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar6;
  vm_tadsobj_hdr *local_28;
  pfq_ele *local_20;
  
  if (in_RDI->inh_path != (tadsobj_objid_and_ptr *)0x0) {
    return in_RDI->inh_path;
  }
  CVmObjTadsInhQueue::clear(&G_tadsobj_queue_X);
  local_20 = (pfq_ele *)0x0;
  local_28 = in_RDI;
  do {
    uVar1 = local_28->sc_cnt;
    pvVar5 = local_28->sc;
    for (uVar6 = 0; uVar6 < uVar1; uVar6 = uVar6 + 1) {
      vVar4 = pvVar5->id;
      ins_pt = (pfq_ele *)pvVar5->objp;
      pCVar2 = (CVmMetaclass *)(*(code *)**(undefined8 **)ins_pt)();
      if (pCVar2 == CVmObjTads::metaclass_reg_) {
        CVmObjTadsInhQueue::insert_obj
                  ((CVmObjTadsInhQueue *)CONCAT44(uVar6,in_stack_ffffffffffffffc0),
                   (vm_obj_id_t)((ulong)pvVar5 >> 0x20),
                   (CVmObjTads *)CONCAT44(vVar4,in_stack_ffffffffffffffb0),ins_pt);
      }
      pvVar5 = pvVar5 + 1;
    }
    do {
      if (local_20 == (pfq_ele *)0x0) {
        local_68 = CVmObjTadsInhQueue::get_head(&G_tadsobj_queue_X);
      }
      else {
        local_68 = local_20->nxt;
      }
      local_20 = local_68;
      if (local_68 == (pfq_ele *)0x0) {
        ptVar3 = CVmObjTadsInhQueue::create_path
                           ((CVmObjTadsInhQueue *)CONCAT44(uVar6,in_stack_ffffffffffffffc0));
        in_RDI->inh_path = ptVar3;
        return ptVar3;
      }
    } while (local_68->obj == 0);
    local_28 = CVmObjTads::get_hdr(local_68->objp);
  } while( true );
}

Assistant:

tadsobj_objid_and_ptr *vm_tadsobj_hdr::get_inh_search_path(VMG0_)
{
    /* if we have a cached path, return it */
    if (inh_path != 0)
        return inh_path;

    /* get the queue builder global */
    CVmObjTadsInhQueue *q = G_tadsobj_queue;

    /*
     *   We haven't already cached a search path for this object, so build
     *   the search path now and save it for future searches.  Start by
     *   clearing the work queue.  
     */
    q->clear();

    /* we're not yet processing the first element */
    pfq_ele *q_ele = 0;

    /* start with self */
    vm_tadsobj_hdr *curhdr = this;

    /* keep going until we run out of queue elements */
    for (;;)
    {
        /* get the superclass count for this object */
        uint cnt = curhdr->sc_cnt;

        /* insert my superclasses right after me */
        pfq_ele *q_ins = q_ele;

        /* enqueue the current object's superclasses */
        uint i;
        vm_tadsobj_sc *scp;
        for (i = 0, scp = curhdr->sc ; i < cnt ; ++i, ++scp)
        {
            /* get the current superclass */
            vm_obj_id_t sc = scp->id;
            CVmObjTads *scobj = scp->objp;

            /* if it's not a TadsObject, skip it */
            if (scobj->get_metaclass_reg() != CVmObjTads::metaclass_reg_)
                continue;

            /* enqueue this superclass */
            q_ins = q->insert_obj(vmg_ sc, scobj, q_ins);
        }

        /* move to the next valid element */
        do
        {
            /* get the next queue element */
            q_ele = (q_ele == 0 ? q->get_head() : q_ele->nxt);

            /* if we're out of elements, we're done */
            if (q_ele == 0)
                goto done;
        }
        while (q_ele->obj == VM_INVALID_OBJ);

        /* get the object header for the queue item */
        curhdr = q_ele->objp->get_hdr();
    }

done:
    /* create and cache a linearized path for the queue, and return it */
    return inh_path = q->create_path();
}